

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sem.c
# Opt level: O2

int nn_sem_wait(nn_sem *self)

{
  FILE *__stream;
  int iVar1;
  int iVar2;
  int *piVar3;
  uint *puVar4;
  char *pcVar5;
  
  iVar1 = sem_wait((sem_t *)self);
  if (iVar1 < 0) {
    piVar3 = __errno_location();
    if (*piVar3 != 4) goto LAB_00116f01;
    iVar2 = -4;
  }
  else {
    iVar2 = 0;
    if (iVar1 != 0) {
LAB_00116f01:
      nn_backtrace_print();
      __stream = _stderr;
      puVar4 = (uint *)__errno_location();
      pcVar5 = nn_err_strerror(*puVar4);
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar5,(ulong)*puVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/src/utils/sem.c",
              0x60);
      fflush(_stderr);
      nn_err_abort();
    }
  }
  return iVar2;
}

Assistant:

int nn_sem_wait (struct nn_sem *self)
{
    int rc;

    rc = sem_wait (&self->sem);
    if (nn_slow (rc < 0 && errno == EINTR))
        return -EINTR;
    errno_assert (rc == 0);
    return 0;
}